

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O2

Expr let(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
        int argc)

{
  size_t key;
  pExecutor exec_00;
  _Bool _Var1;
  ValueType VVar2;
  int iVar3;
  Expr *pEVar4;
  pContext context;
  long lVar6;
  char *__s;
  anon_union_8_8_707b72ea_for_Expr_1 *paVar7;
  Expr EVar8;
  Expr EVar9;
  Expr expr;
  Expr expr_00;
  Expr a;
  Expr expr_01;
  Expr b;
  Expr expr_02;
  Expr value;
  int len;
  int local_58;
  int var_cnt;
  Expr *local_50;
  Expr *local_48;
  pExecutor local_40;
  long local_38;
  anon_union_8_8_707b72ea_for_Expr_1 aVar5;
  
  if (argc < 2) {
    __s = "let: too few arguments";
  }
  else {
    EVar8._4_4_ = 0;
    EVar8.type = args->type;
    EVar8.field_1.val_atom = (args->field_1).val_atom;
    local_58 = argc;
    _Var1 = is_pair(EVar8);
    if (!_Var1) {
      a._4_4_ = 0;
      a.type = args->type;
      b._4_4_ = 0;
      b.type = (exec->nil).type;
      a.field_1.val_atom = (args->field_1).val_atom;
      b.field_1.val_atom = (exec->nil).field_1.val_atom;
      _Var1 = is_equal(a,b);
      if (!_Var1) {
        __s = "let: first argument not a list";
        goto LAB_0010617f;
      }
    }
    expr._4_4_ = 0;
    expr.type = args->type;
    expr.field_1.val_atom = (args->field_1).val_atom;
    local_48 = args;
    pEVar4 = get_list(exec,expr,&var_cnt);
    context = context_inherit(callContext);
    paVar7 = &pEVar4->field_1;
    lVar6 = 0;
    local_50 = pEVar4;
    local_40 = exec;
    while( true ) {
      exec_00 = local_40;
      if (var_cnt <= lVar6) {
        free(local_50);
        EVar8 = exec_eval_array(exec_00,context,local_48 + 1,local_58 + -1);
        EVar9.field_1 = EVar8.field_1;
        EVar9.type = EVar8.type;
        context_unlink(context);
        EVar9._4_4_ = 0;
        return EVar9;
      }
      expr_00._4_4_ = 0;
      expr_00.type = ((Expr *)(paVar7 + -1))->type;
      expr_00.field_1.val_atom = paVar7->val_atom;
      pEVar4 = get_list(local_40,expr_00,&len);
      if ((len == 0) || (2 < len)) break;
      expr_01._4_4_ = 0;
      expr_01.type = pEVar4->type;
      expr_01.field_1.val_atom = (pEVar4->field_1).val_atom;
      _Var1 = is_atom(expr_01);
      if (!_Var1) break;
      key = (pEVar4->field_1).val_atom;
      local_38 = lVar6;
      if (len == 1) {
        VVar2 = (exec_00->nil).type;
        aVar5 = (anon_union_8_8_707b72ea_for_Expr_1)(exec_00->nil).field_1.val_atom;
      }
      else {
        expr_02._4_4_ = 0;
        expr_02.type = pEVar4[1].type;
        expr_02.field_1.val_atom = pEVar4[1].field_1.val_atom;
        EVar8 = exec_eval(exec_00,context,expr_02);
        aVar5 = EVar8.field_1;
        VVar2 = EVar8.type;
      }
      free(pEVar4);
      value._4_4_ = 0;
      value.type = VVar2;
      value.field_1.val_atom = aVar5.val_atom;
      iVar3 = context_bind(context,key,value);
      if (iVar3 == -1) {
        __s = "let context_bind failed";
        goto LAB_0010617f;
      }
      lVar6 = local_38 + 1;
      paVar7 = paVar7 + 2;
    }
    __s = "let: invalid initializer";
  }
LAB_0010617f:
  puts(__s);
  exit(1);
}

Assistant:

BUILTIN_FUNC(let)
{
    if (argc < 2)
    {
        log("let: too few arguments");
        exit(1);
    }
    if (!is_pair(args[0]) && !is_equal(args[0], exec->nil))
    {
        log("let: first argument not a list");
        exit(1);
    }
    int var_cnt;
    Expr *var_list = get_list(exec, args[0], &var_cnt);

    pContext context = context_inherit(callContext);
    for (int i = 0; i < var_cnt; i++)
    {
        int len;
        Expr *list = get_list(exec, var_list[i], &len);
        if (len == 0 || len > 2 || !is_atom(list[0]))
        {
            log("let: invalid initializer");
            exit(1);
        }
        Expr name = list[0];
        Expr value;
        if (len == 1)
            value = exec->nil;
        else
            value = exec_eval(exec, context, list[1]);
        free(list);
        if (context_bind(context, name.val_atom, value) == MAP_FAILED)
        {
            log("let context_bind failed");
            exit(1);
        }
    }
    free(var_list);

    Expr res = exec_eval_array(exec, context, args + 1, argc - 1);
    context_unlink(context);

    return res;
}